

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.c
# Opt level: O2

uint16_t patch(dw_rom *rom,uint32_t address,uint32_t size,uint8_t *data)

{
  uint8_t *puVar1;
  ulong uVar2;
  
  puVar1 = rom->content;
  for (uVar2 = 0; size != uVar2; uVar2 = uVar2 + 1) {
    puVar1[uVar2 + address] = data[uVar2];
  }
  return ((short)uVar2 + (short)address + (short)puVar1) - *(short *)&rom->content;
}

Assistant:

uint16_t patch(const dw_rom *rom, uint32_t address, const uint32_t size,
                      const uint8_t *data)
{
    uint32_t i;
    uint8_t *p;

    p = &rom->content[address];

    for (i=0; i < size; i++) {
        *(p++) = data[i];
    }
    return p - rom->content;
}